

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O1

int ERKStepGetTimestepperStats
              (void *arkode_mem,long *expsteps,long *accsteps,long *attempts,long *fevals,
              long *netfails)

{
  ARKodeHAdaptMem pAVar1;
  int iVar2;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeERKStepMem local_38;
  ARKodeMem local_30;
  
  iVar2 = erkStep_AccessStepMem(arkode_mem,"ERKStepGetTimestepperStats",&local_30,&local_38);
  if (iVar2 == 0) {
    pAVar1 = local_30->hadapt_mem;
    *expsteps = pAVar1->nst_exp;
    *accsteps = pAVar1->nst_acc;
    *attempts = local_30->nst_attempts;
    *fevals = local_38->nfe;
    *netfails = local_30->netf;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ERKStepGetTimestepperStats(void *arkode_mem, long int *expsteps,
                               long int *accsteps, long int *attempts,
                               long int *fevals, long int *netfails)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepGetTimestepperStats",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* set expsteps and accsteps from adaptivity structure */
  *expsteps = ark_mem->hadapt_mem->nst_exp;
  *accsteps = ark_mem->hadapt_mem->nst_acc;

  /* set remaining outputs */
  *attempts = ark_mem->nst_attempts;
  *fevals   = step_mem->nfe;
  *netfails = ark_mem->netf;

  return(ARK_SUCCESS);
}